

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::statementList(Parse *this)

{
  int iVar1;
  int iVar2;
  int index;
  Parse *this_local;
  
  iVar1 = this->curIndex;
  iVar2 = statement(this);
  if (iVar2 == 0) {
    this->curIndex = iVar1;
  }
  else {
    statementList(this);
  }
  return 1;
}

Assistant:

int Parse::statementList() {
    int index = curIndex;
    if (statement()) {
        statementList();
        return 1;
    }
    curIndex = index;
    return 1;
}